

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O0

QString * fixedComment(QString *data,bool *ok)

{
  long lVar1;
  QString *in_RDX;
  QString *in_RDI;
  long in_FS_OFFSET;
  qsizetype idx;
  QString fixedData;
  QString *this;
  QLatin1StringView in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (QDomImplementationPrivate::invalidDataPolicy == AcceptInvalidChars) {
    *(undefined1 *)&(in_RDX->d).d = 1;
    QString::QString(in_RDI,in_RDI);
    this = in_RDI;
  }
  else {
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    this = in_RDI;
    fixedCharData(in_RDX,(bool *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    if (((ulong)(in_RDX->d).d & 1) == 0) {
      QString::QString((QString *)0x11b36c);
    }
    else {
      while( true ) {
        in_stack_ffffffffffffffa8 =
             Qt::Literals::StringLiterals::operator____L1
                       ((char *)in_stack_ffffffffffffffa8.m_size,(size_t)this);
        lVar1 = QString::indexOf((QLatin1String *)&local_20,in_stack_ffffffffffffffa8.m_size,
                                 (CaseSensitivity)in_stack_ffffffffffffffa8.m_data);
        if (lVar1 == -1) break;
        if (QDomImplementationPrivate::invalidDataPolicy == ReturnNullNode) {
          *(undefined1 *)&(in_RDX->d).d = 0;
          QString::QString((QString *)0x11b3dd);
          goto LAB_0011b41e;
        }
        QString::remove((longlong)&local_20,lVar1);
      }
      *(undefined1 *)&(in_RDX->d).d = 1;
      QString::QString(this,in_RDI);
    }
LAB_0011b41e:
    QString::~QString((QString *)0x11b428);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return this;
}

Assistant:

static QString fixedComment(const QString &data, bool *ok)
{
    if (QDomImplementationPrivate::invalidDataPolicy == QDomImplementation::AcceptInvalidChars) {
        *ok = true;
        return data;
    }

    QString fixedData = fixedCharData(data, ok);
    if (!*ok)
        return QString();

    for (;;) {
        qsizetype idx = fixedData.indexOf("--"_L1);
        if (idx == -1)
            break;
        if (QDomImplementationPrivate::invalidDataPolicy == QDomImplementation::ReturnNullNode) {
            *ok = false;
            return QString();
        }
        fixedData.remove(idx, 2);
    }

    *ok = true;
    return fixedData;
}